

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O1

Sequence * __thiscall
Sequence::subsequence(Sequence *__return_storage_ptr__,Sequence *this,int begin,int end)

{
  long lVar1;
  ulong uVar2;
  value_type vVar3;
  _Map_pointer ppiVar4;
  _Elt_pointer piVar5;
  reference pvVar6;
  long lVar7;
  value_type *pvVar8;
  long lVar9;
  ulong uVar10;
  size_type __n;
  
  Sequence(__return_storage_ptr__,end - begin);
  lVar9 = (long)begin * 4;
  for (__n = 0; ppiVar4 = (__return_storage_ptr__->m_bits).
                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node,
      (long)__n <
      (long)(int)((int)((ulong)((long)(__return_storage_ptr__->m_bits).
                                      super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                      super__Deque_impl_data._M_start._M_last -
                               (long)(__return_storage_ptr__->m_bits).
                                     super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                     super__Deque_impl_data._M_start._M_cur) >> 2) +
                  (int)((ulong)((long)(__return_storage_ptr__->m_bits).
                                      super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                      super__Deque_impl_data._M_finish._M_cur -
                               (long)(__return_storage_ptr__->m_bits).
                                     super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                     super__Deque_impl_data._M_finish._M_first) >> 2) +
                 ((((uint)((int)ppiVar4 -
                          *(int *)&(__return_storage_ptr__->m_bits).
                                   super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (uint)(ppiVar4 == (_Map_pointer)0x0)) * 0x80); __n = __n + 1) {
    piVar5 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    lVar7 = (long)piVar5 -
            (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 2;
    lVar1 = __n + (long)begin;
    uVar2 = lVar1 + lVar7;
    if (uVar2 < 0x80) {
      pvVar8 = (value_type *)((long)piVar5 + lVar9);
    }
    else {
      uVar10 = (uVar2 >> 7) + 0xfe00000000000000;
      if (0 < (long)uVar2) {
        uVar10 = uVar2 >> 7;
      }
      pvVar8 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar10] + lVar1 + lVar7 + uVar10 * -0x80;
    }
    vVar3 = *pvVar8;
    pvVar6 = std::deque<int,_std::allocator<int>_>::at(&__return_storage_ptr__->m_bits,__n);
    *pvVar6 = vVar3;
    lVar9 = lVar9 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::subsequence(int begin, int end) {
    Sequence seq(end - begin);
    for (auto i = 0; i < seq.size(); ++i) {
        seq[i] = m_bits[begin + i];
    }
    return seq;
}